

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O3

char * apprun_shell_expand_variables(char *str,char **argv)

{
  char cVar1;
  char *pcVar2;
  char *__s;
  size_t sVar3;
  uint uVar4;
  uint new_size;
  char *pcVar5;
  int iVar6;
  char *local_48;
  
  if (str == (char *)0x0) {
    local_48 = (char *)0x0;
  }
  else {
    local_48 = (char *)calloc(1,8);
    cVar1 = *str;
    if (cVar1 != '\0') {
      uVar4 = 0;
      new_size = 1;
      do {
        iVar6 = 0;
        pcVar5 = str;
        while ((cVar1 != '\0' && (cVar1 != '$'))) {
          pcVar2 = pcVar5 + 1;
          pcVar5 = pcVar5 + 1;
          iVar6 = iVar6 + -1;
          cVar1 = *pcVar2;
        }
        pcVar2 = apprun_shell_find_var_end(pcVar5);
        if (str < pcVar5) {
          uVar4 = uVar4 - iVar6;
          if (new_size < uVar4) {
            new_size = new_size - iVar6;
            local_48 = apprun_string_extend(local_48,new_size);
          }
          strncat(local_48,str,(ulong)(uint)-iVar6);
        }
        if (pcVar5 != pcVar2) {
          pcVar5 = apprun_shell_extract_var_name(pcVar5);
          __s = apprun_shell_resolve_var_value(argv,pcVar5);
          free(pcVar5);
          if (__s != (char *)0x0) {
            sVar3 = strlen(__s);
            uVar4 = uVar4 + (int)sVar3;
            if (new_size < uVar4) {
              new_size = new_size + (int)sVar3;
              local_48 = apprun_string_extend(local_48,new_size);
            }
            strcat(local_48,__s);
            free(__s);
          }
        }
        cVar1 = *pcVar2;
        str = pcVar2;
      } while (cVar1 != '\0');
    }
  }
  return local_48;
}

Assistant:

char *apprun_shell_expand_variables(char const *str, char **argv) {
    if (str == NULL)
        return NULL;

    unsigned buffer_capacity = 1;
    unsigned buffer_len = 0;
    char *buffer = calloc(buffer_capacity, sizeof(char *));

    char const *itr = str;

    while (*itr != '\0') {
        char const *var_start = apprun_shell_find_var_start(itr);
        char const *var_end = apprun_shell_find_var_end(var_start);


        if (var_start > itr) {
            unsigned section_len = var_start - itr;
            if (buffer_len + section_len > buffer_capacity) {
                buffer_capacity = buffer_capacity + section_len;
                buffer = apprun_string_extend(buffer, buffer_capacity);
            }

            strncat(buffer, itr, section_len);
            buffer_len += section_len;
        }


        if (var_start != var_end) {
            char *var_name = apprun_shell_extract_var_name(var_start);
            char *var_value = apprun_shell_resolve_var_value(argv, var_name);

            free(var_name);

            if (var_value) {
                unsigned section_len = strlen(var_value);
                if (buffer_len + section_len > buffer_capacity) {
                    buffer_capacity = buffer_capacity + section_len;
                    buffer = apprun_string_extend(buffer, buffer_capacity);
                }

                strcat(buffer, var_value);
                buffer_len += section_len;
                free(var_value);
            }
        }

        itr = var_end;
    }


    return buffer;
}